

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.cc
# Opt level: O0

void __thiscall flow::Runner::consume(Runner *this,Opcode opcode)

{
  uint uVar1;
  QuotaExceeded *this_00;
  uint price;
  Opcode opcode_local;
  Runner *this_local;
  
  if (this->quota_ != -1) {
    uVar1 = getPrice(opcode);
    if (this->quota_ <= (long)(ulong)uVar1) {
      this->quota_ = 0;
      this_00 = (QuotaExceeded *)__cxa_allocate_exception(0x10);
      QuotaExceeded::QuotaExceeded(this_00);
      __cxa_throw(this_00,&QuotaExceeded::typeinfo,QuotaExceeded::~QuotaExceeded);
    }
    this->quota_ = this->quota_ - (ulong)uVar1;
  }
  return;
}

Assistant:

void Runner::consume(Opcode opcode) {
  if (quota_ == NoQuota)
    return;

  unsigned price = getPrice(opcode);
  if (price >= quota_) {
    quota_ = 0;
    throw QuotaExceeded{};
  }

  quota_ -= price;
}